

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PInt::PInt(PInt *this,uint size,bool unsign)

{
  DObject *pDVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  
  PType::PType((PType *)this,size,size);
  *(undefined ***)this = &PTR_StaticType_00846640;
  this->Unsigned = unsign;
  if ((int)CONCAT71(in_register_00000011,unsign) == 0) {
    uVar2 = -1 << ((char)(size << 3) - 1U & 0x1f);
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                          ,0x1f7);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x23a;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_008479b0;
    *(uint *)&pDVar1[1].Class = uVar2;
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                          ,0x1f7);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x23b;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_008479b0;
    *(uint *)&pDVar1[1].Class = ~uVar2;
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
  }
  else {
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                          ,0x1f7);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x23a;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_008479b0;
    *(undefined4 *)&pDVar1[1].Class = 0;
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
    pDVar1 = (DObject *)
             M_Malloc_Dbg(0x38,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                          ,0x1f7);
    DObject::DObject(pDVar1);
    *(undefined4 *)&pDVar1->field_0x24 = 0x23b;
    pDVar1[1]._vptr_DObject = (_func_int **)this;
    pDVar1->_vptr_DObject = (_func_int **)&PTR_StaticType_008479b0;
    *(int *)&pDVar1[1].Class = ~(-1 << ((byte)(size << 3) & 0x1f));
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pDVar1);
  }
  return;
}

Assistant:

PInt::PInt(unsigned int size, bool unsign)
: PBasicType(size, size), Unsigned(unsign)
{
	if (!unsign)
	{
		int maxval = (1 << ((8 * size) - 1)) - 1;
		int minval = -maxval - 1;
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, minval));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, maxval));
	}
	else
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, 0u));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, (1u << (8 * size)) - 1));
	}
}